

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SpectrumDotsTexture::Evaluate
          (SpectrumDotsTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  undefined8 uVar1;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  SampledWavelengths lambda_00;
  SampledWavelengths lambda_01;
  TextureEvalContext ctx_02;
  array<float,_4> aVar2;
  bool bVar3;
  undefined8 in_RDI;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 extraout_var [56];
  undefined1 auVar7 [56];
  undefined1 auVar6 [64];
  ulong in_XMM1_Qa;
  undefined1 auVar10 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  SampledSpectrum SVar11;
  Point2f st;
  Vector2f dstdy;
  Vector2f dstdx;
  Point2f *in_stack_fffffffffffffe88;
  Vector2f *in_stack_fffffffffffffe90;
  TextureMapping2DHandle *in_stack_fffffffffffffe98;
  undefined8 *puVar12;
  undefined1 (*pauVar13) [64];
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 local_28 [8];
  undefined1 local_20 [16];
  undefined8 local_10;
  undefined8 local_8;
  
  puVar12 = (undefined8 *)&stack0x00000048;
  pauVar13 = (undefined1 (*) [64])&stack0x00000008;
  puVar14 = local_20;
  Vector2<float>::Vector2((Vector2<float> *)0x6f000b);
  puVar15 = local_28;
  Vector2<float>::Vector2((Vector2<float> *)0x6f0020);
  auVar4 = vmovdqu64_avx512f(*pauVar13);
  auVar4 = vmovdqu64_avx512f(auVar4);
  auVar4 = vmovdqu64_avx512f(auVar4);
  vmovdqu64_avx512f(auVar4);
  ctx_02._8_8_ = puVar14;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_RDI;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_RDI >> 0x20);
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = puVar15;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffec8;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffed0;
  ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffed8;
  ctx_02.dudx = (Float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  ctx_02.dudy = (Float)(int)in_stack_fffffffffffffee0;
  ctx_02.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  ctx_02.dvdy = (Float)(int)in_stack_fffffffffffffee8;
  ctx_02.faceIndex = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  auVar4._0_8_ = TextureMapping2DHandle::Map
                           (in_stack_fffffffffffffe98,ctx_02,in_stack_fffffffffffffe90,
                            (Vector2f *)in_stack_fffffffffffffe88);
  auVar4._8_56_ = extraout_var;
  vmovlpd_avx(auVar4._0_16_);
  bVar3 = DotsBase::Inside(in_stack_fffffffffffffe88);
  if (bVar3) {
    auVar4 = vmovdqu64_avx512f(*pauVar13);
    auVar4 = vmovdqu64_avx512f(auVar4);
    auVar5 = vmovdqu64_avx512f(auVar4);
    auVar4 = vmovdqu64_avx512f(auVar5);
    auVar7 = ZEXT856(auVar5._8_8_);
    auVar10 = ZEXT856(in_XMM1_Qa);
    ctx_00._8_8_ = *puVar12;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)auVar4._56_8_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)auVar4._56_8_ >> 0x20);
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = puVar12[1];
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar12[2];
    ctx_00._32_8_ = puVar12[3];
    ctx_00._40_8_ = in_stack_fffffffffffffe98;
    ctx_00._48_8_ = puVar12;
    ctx_00._56_8_ = pauVar13;
    lambda_00.lambda.values._8_8_ = puVar14;
    lambda_00.lambda.values[0] = (float)(int)in_RDI;
    lambda_00.lambda.values[1] = (float)(int)((ulong)in_RDI >> 0x20);
    lambda_00.pdf.values._0_8_ = puVar15;
    lambda_00.pdf.values[2] = (float)(int)in_stack_fffffffffffffec8;
    lambda_00.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    SVar11 = SpectrumTextureHandle::Evaluate(auVar4._24_8_,ctx_00,lambda_00);
    auVar8._0_8_ = SVar11.values.values._8_8_;
    auVar8._8_56_ = auVar10;
    auVar5._0_8_ = SVar11.values.values._0_8_;
    auVar5._8_56_ = auVar7;
    local_10 = vmovlpd_avx(auVar5._0_16_);
    local_8 = vmovlpd_avx(auVar8._0_16_);
  }
  else {
    auVar4 = vmovdqu64_avx512f(*pauVar13);
    auVar4 = vmovdqu64_avx512f(auVar4);
    uVar1 = *puVar12;
    auVar5 = vmovdqu64_avx512f(auVar4);
    auVar4 = vmovdqu64_avx512f(auVar5);
    auVar7 = ZEXT856(auVar5._8_8_);
    auVar10 = ZEXT856(in_XMM1_Qa);
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)uVar1;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uVar1 >> 0x20);
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)auVar4._56_8_;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)auVar4._56_8_ >> 0x20);
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = puVar12[1];
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = puVar12[2];
    ctx_01._32_8_ = puVar12[3];
    ctx_01._40_8_ = in_stack_fffffffffffffe98;
    ctx_01._48_8_ = puVar12;
    ctx_01._56_8_ = pauVar13;
    lambda_01.lambda.values._8_8_ = puVar14;
    lambda_01.lambda.values[0] = (float)(int)in_RDI;
    lambda_01.lambda.values[1] = (float)(int)((ulong)in_RDI >> 0x20);
    lambda_01.pdf.values._0_8_ = puVar15;
    lambda_01.pdf.values[2] = (float)(int)uVar1;
    lambda_01.pdf.values[3] = (float)(int)((ulong)uVar1 >> 0x20);
    SVar11 = SpectrumTextureHandle::Evaluate(auVar4._24_8_,ctx_01,lambda_01);
    auVar9._0_8_ = SVar11.values.values._8_8_;
    auVar9._8_56_ = auVar10;
    auVar6._0_8_ = SVar11.values.values._0_8_;
    auVar6._8_56_ = auVar7;
    local_10 = vmovlpd_avx(auVar6._0_16_);
    local_8 = vmovlpd_avx(auVar9._0_16_);
  }
  aVar2.values[2] = (float)(undefined4)local_8;
  aVar2.values[3] = (float)local_8._4_4_;
  aVar2.values[0] = (float)(undefined4)local_10;
  aVar2.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar2.values;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Inside(st) ? insideDot.Evaluate(ctx, lambda)
                          : outsideDot.Evaluate(ctx, lambda);
    }